

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::BayesianProbitRegressor_FeatureWeight
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_FeatureWeight_003dcf68;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->weights_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(from->weights_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->featureid_ = from->featureid_;
  return;
}

Assistant:

BayesianProbitRegressor_FeatureWeight::BayesianProbitRegressor_FeatureWeight(const BayesianProbitRegressor_FeatureWeight& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      weights_(from.weights_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  featureid_ = from.featureid_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
}